

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

qint64 __thiscall
QSocks5SocketEngine::readDatagram
          (QSocks5SocketEngine *this,char *data,qint64 maxlen,QIpPacketHeader *header,
          PacketHeaderOptions param_5)

{
  bool bVar1;
  Promoted<int,_long_long> PVar2;
  char *__src;
  long in_RCX;
  void *in_RSI;
  long in_FS_OFFSET;
  int copyLen;
  QSocks5SocketEnginePrivate *d;
  QSocks5RevivedDatagram datagram;
  QQueue<QSocks5RevivedDatagram> *in_stack_ffffffffffffff68;
  QSocks5RevivedDatagram *in_stack_ffffffffffffff70;
  long local_48;
  qsizetype local_40;
  int local_34;
  QByteArray local_30;
  undefined2 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSocks5SocketEngine *)0x37453f);
  bVar1 = QList<QSocks5RevivedDatagram>::isEmpty((QList<QSocks5RevivedDatagram> *)0x374559);
  if (bVar1) {
    local_48 = 0;
  }
  else {
    memset(&local_30,0xaa,0x28);
    QQueue<QSocks5RevivedDatagram>::dequeue(in_stack_ffffffffffffff68);
    local_40 = QByteArray::size(&local_30);
    PVar2 = qMin<int,long_long>(&local_34,&local_40);
    __src = QByteArray::constData((QByteArray *)0x3745da);
    memcpy(in_RSI,__src,(long)(int)PVar2);
    if (in_RCX != 0) {
      QHostAddress::operator=
                ((QHostAddress *)in_stack_ffffffffffffff70,(QHostAddress *)in_stack_ffffffffffffff68
                );
      *(undefined2 *)(in_RCX + 0x1c) = local_10;
    }
    local_48 = (long)(int)PVar2;
    QSocks5RevivedDatagram::~QSocks5RevivedDatagram(in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::readDatagram(char *data, qint64 maxlen, QIpPacketHeader *header, PacketHeaderOptions)
{
#ifndef QT_NO_UDPSOCKET
    Q_D(QSocks5SocketEngine);

    if (d->udpData->pendingDatagrams.isEmpty())
        return 0;

    QSocks5RevivedDatagram datagram = d->udpData->pendingDatagrams.dequeue();
    int copyLen = qMin<int>(maxlen, datagram.data.size());
    memcpy(data, datagram.data.constData(), copyLen);
    if (header) {
        header->senderAddress = datagram.address;
        header->senderPort = datagram.port;
    }
    return copyLen;
#else
    Q_UNUSED(data);
    Q_UNUSED(maxlen);
    Q_UNUSED(header);
    return -1;
#endif // QT_NO_UDPSOCKET
}